

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

void store_update(void)

{
  town *ptVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  level_map_conflict *plVar5;
  long lVar6;
  store *psVar7;
  
  plVar5 = world;
  if ((player->opts).opt[0x1a] == true) {
    msg("Updating Shops...");
    plVar5 = world;
  }
joined_r0x001cfabb:
  do {
    world = plVar5;
    if (daycount == 0) {
      daycount = 0;
      if ((player->opts).opt[0x1a] != true) {
        return;
      }
      msg("Done.");
      return;
    }
    daycount = daycount - 1;
    if (0 < plVar5->num_towns) {
      lVar6 = 0;
      do {
        psVar7 = plVar5->towns[lVar6].stores;
        uVar2 = store_home_idx;
        for (; psVar7 != (store *)0x0; psVar7 = psVar7->next) {
          if (psVar7->sidx != uVar2) {
            store_maint(psVar7);
            uVar2 = store_home_idx;
          }
          plVar5 = world;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < plVar5->num_towns);
    }
    uVar3 = Rand_div((uint)z_info->store_shuffle);
    plVar5 = world;
  } while (uVar3 != 0);
  if ((player->opts).opt[0x1a] == true) {
    msg("Shuffling a Shopkeeper...");
  }
  do {
    do {
      uVar3 = Rand_div(world->num_towns);
      ptVar1 = world->towns;
      uVar4 = Rand_div((uint)z_info->store_max);
    } while (uVar4 == store_home_idx);
    psVar7 = (store *)&ptVar1[(int)uVar3].stores;
    while (psVar7 = psVar7->next, psVar7 != (store *)0x0) {
      if (uVar4 == psVar7->sidx) {
        store_shuffle(psVar7);
        plVar5 = world;
        goto joined_r0x001cfabb;
      }
    }
  } while( true );
}

Assistant:

void store_update(void)
{
	if (OPT(player, cheat_xtra)) msg("Updating Shops...");
	while (daycount--) {
		int i;
		struct store *s;

		/* Maintain each shop (except home) */
		for (i = 0; i < world->num_towns; i++) {
			struct town *town = &world->towns[i];
			for (s = town->stores; s; s = s->next) {
				/* Skip the home */
				if (store_is_home(s)) continue;

				/* Maintain */
				store_maint(s);
			}
		}

		/* Sometimes, shuffle the shop-keepers */
		if (one_in_(z_info->store_shuffle)) {
			/* Message */
			if (OPT(player, cheat_xtra)) msg("Shuffling a Shopkeeper...");

			/* Pick a random shop in a random town */
			while (1) {
				int m = randint0(world->num_towns);
				struct town *town = &world->towns[m];
				unsigned int n = randint0(z_info->store_max);
				if (n == store_home_idx) continue;
				for (s = town->stores; s; s = s->next) {
					if (n == s->sidx) break;
				}
				if (s) break;
			}

			/* Shuffle it */
			store_shuffle(s);
		}
	}
	daycount = 0;
	if (OPT(player, cheat_xtra)) msg("Done.");
}